

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

void __thiscall nuraft::buffer::get(buffer *this,ptr<buffer> *dst)

{
  element_type *peVar1;
  size_t sVar2;
  size_t sVar3;
  size_t __n;
  byte *__dest;
  byte *__src;
  buffer *in_RDI;
  size_t sz;
  
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1da142);
  sVar2 = size(peVar1);
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1da159);
  sVar3 = pos(peVar1);
  __n = sVar2 - sVar3;
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1da17b);
  __dest = data(peVar1);
  __src = data(in_RDI);
  memcpy(__dest,__src,__n);
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + (short)__n;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + (int)__n;
  }
  return;
}

Assistant:

void buffer::get(ptr<buffer>& dst) {
    size_t sz = dst->size() - dst->pos();
    ::memcpy(dst->data(), data(), sz);
    __mv_fw_block(this, sz);
}